

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O0

void GC::MarkPendingRoots(void)

{
  char **ppcVar1;
  FastVector<char_*,_false,_false> *pFVar2;
  FastVector<char_*,_false,_false> *this;
  bool bVar3;
  uint uVar4;
  char **e;
  char **c;
  FastVector<char_*,_false,_false> *tmp;
  
  if ((next != (FastVector<char_*,_false,_false> *)0x0) &&
     (bVar3 = FastVector<char_*,_false,_false>::empty(next), !bVar3)) {
    while (uVar4 = FastVector<char_*,_false,_false>::size(next), this = next, pFVar2 = curr,
          uVar4 != 0) {
      curr = next;
      next = pFVar2;
      e = this->data;
      ppcVar1 = this->data;
      uVar4 = FastVector<char_*,_false,_false>::size(this);
      for (; e != ppcVar1 + uVar4; e = e + 1) {
        CheckBasePointer(*e);
      }
      FastVector<char_*,_false,_false>::clear(curr);
    }
  }
  return;
}

Assistant:

void GC::MarkPendingRoots()
{
	if(!GC::next)
		return;

	if(GC::next->empty())
		return;

	while(GC::next->size())
	{
		GC_DEBUG_PRINT("Checking new roots\n");

		FastVector<char*> *tmp = GC::curr;
		GC::curr = GC::next;
		GC::next = tmp;

		for(char **c = GC::curr->data, **e = GC::curr->data + GC::curr->size(); c != e; c++)
		{
			GC_DEBUG_PRINT("\tRoot pointer base is %p\n", *c);

			GC::CheckBasePointer(*c);
		}

		GC::curr->clear();
	}

	GC_DEBUG_PRINT("\n");
}